

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O2

int do_exec(int nargs,char **args)

{
  __pid_t __pid;
  int __status;
  uint uVar1;
  bool bVar2;
  int status;
  undefined4 uStack_124;
  
  if (*args[(long)nargs + -1] == '&') {
    bVar2 = args[(long)nargs + -1][1] == '\0';
  }
  else {
    bVar2 = false;
  }
  __pid = fork();
  if (__pid != 0) {
    uVar1 = 0;
    if (bVar2 == false) {
      waitpid(__pid,&status,0);
      if ((status & 0x7fU) == 0) {
        uVar1 = (uint)status >> 8 & 0xff;
      }
      else {
        uVar1 = 1;
      }
    }
    return uVar1;
  }
  memset(&status,0,0x100);
  memcpy(&status,args + 1,(long)(int)(~(uint)bVar2 + nargs) << 3);
  __status = execv((char *)CONCAT44(uStack_124,status),(char **)&status);
  _exit(__status);
}

Assistant:

int do_exec(int nargs, char **args)
{
    int ret, status, background = 0;
    char *ptrs[32];

    if(!strcmp(args[nargs-1], "&")) {
        background = 1;
        --nargs;
    }
    ret = fork();
    if (ret) {
        if (!background) {
            waitpid(ret, &status, 0);
            if (WIFEXITED(status))
                return WEXITSTATUS(status);
            else
               return 1;
        }
        return 0;
    }

    memset(ptrs, 0, sizeof(ptrs));
    memcpy(ptrs, &args[1], (nargs-1)*sizeof(char*));
    ret = execv(ptrs[0], ptrs);
    _exit(ret);
}